

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryBefore
          (CollationRootElements *this,uint32_t p,uint32_t s,uint32_t t)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint *puVar6;
  long lVar7;
  
  if (p == 0) {
    puVar5 = this->elements;
    lVar7 = (long)(int)puVar5[s != 0];
    uVar3 = (uint)(s != 0) << 8;
    uVar4 = (ulong)(puVar5[lVar7] & 0xffffff7f);
  }
  else {
    iVar2 = findP(this,p);
    puVar5 = this->elements;
    lVar7 = (long)iVar2 + 1;
    uVar3 = puVar5[(long)iVar2 + 1] & 0xffffff7f;
    if (0x50004ff < uVar3) {
      uVar3 = 0x5000500;
    }
    uVar4 = (ulong)uVar3;
    if (-1 < (char)puVar5[(long)iVar2 + 1]) {
      uVar4 = 0x5000500;
    }
    uVar3 = 0x100;
  }
  puVar6 = puVar5 + lVar7;
  while ((uint)uVar4 < (s << 0x10 | t)) {
    if ((uint32_t)(uVar4 >> 0x10) == s) {
      uVar3 = (uint)uVar4;
    }
    uVar1 = *puVar6;
    puVar6 = puVar6 + 1;
    uVar4 = (ulong)(uVar1 & 0xffffff7f);
  }
  return uVar3 & 0xffff;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryBefore(uint32_t p, uint32_t s, uint32_t t) const {
    U_ASSERT((t & ~Collation::ONLY_TERTIARY_MASK) == 0);
    int32_t index;
    uint32_t previousTer, secTer;
    if(p == 0) {
        if(s == 0) {
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the beginning of the tertiary CE range.
            previousTer = 0;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            previousTer = Collation::BEFORE_WEIGHT16;
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        index = findPrimary(p) + 1;
        previousTer = Collation::BEFORE_WEIGHT16;
        secTer = getFirstSecTerForPrimary(index);
    }
    uint32_t st = (s << 16) | t;
    while(st > secTer) {
        if((secTer >> 16) == s) { previousTer = secTer; }
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        secTer = elements[index++] & ~SEC_TER_DELTA_FLAG;
    }
    U_ASSERT(secTer == st);
    return previousTer & 0xffff;
}